

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O1

void __thiscall DiskTableNode::loadIndexFilter(DiskTableNode *this)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  size_t n;
  SSTableIndex *pSVar4;
  IndexMap *pIVar5;
  SSTableHeader *pSVar6;
  BloomFilter<long_long> *this_00;
  _Rb_tree_header *p_Var7;
  iterator __end2;
  SSTableIndexItem *item;
  pointer data;
  pair<const_long_long,_unsigned_long> local_40;
  
  if ((this->index == (IndexMap *)0x0) && (this->filter == (Filter *)0x0)) {
    pSVar4 = SSTable::getIndex(this->_sstable);
    pSVar1 = (pSVar4->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pSVar2 = (pSVar4->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pSVar3 = (pSVar4->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>).
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (pSVar4->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar4->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar4->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar5 = (IndexMap *)operator_new(0x30);
    p_Var7 = &(pIVar5->_M_t)._M_impl.super__Rb_tree_header;
    (pIVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pIVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (pIVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (pIVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&(pIVar5->_M_t)._M_impl = 0;
    *(undefined8 *)&(pIVar5->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (pIVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header;
    (pIVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var7->_M_header;
    (pIVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    this->index = pIVar5;
    pSVar6 = SSTable::getHeader(this->_sstable);
    n = pSVar6->entries_count;
    this_00 = (BloomFilter<long_long> *)operator_new(0x60);
    BloomFilter<long_long>::BloomFilter(this_00,n * 10,n,0,4);
    this->filter = this_00;
    if (pSVar1 != pSVar2) {
      data = pSVar1;
      do {
        local_40.first = data->key;
        local_40.second = data->offset;
        std::
        _Rb_tree<long_long,std::pair<long_long_const,unsigned_long>,std::_Select1st<std::pair<long_long_const,unsigned_long>>,std::less<long_long>,std::allocator<std::pair<long_long_const,unsigned_long>>>
        ::_M_insert_unique<std::pair<long_long_const,unsigned_long>>
                  ((_Rb_tree<long_long,std::pair<long_long_const,unsigned_long>,std::_Select1st<std::pair<long_long_const,unsigned_long>>,std::less<long_long>,std::allocator<std::pair<long_long_const,unsigned_long>>>
                    *)this->index,&local_40);
        BloomFilter<long_long>::add(this->filter,&data->key);
        data = data + 1;
      } while (data != pSVar2);
    }
    if (pSVar1 != (pointer)0x0) {
      operator_delete(pSVar1,(long)pSVar3 - (long)pSVar1);
    }
  }
  return;
}

Assistant:

void DiskTableNode::loadIndexFilter() {
    if (index == nullptr && filter == nullptr) {
        // Info from _sstable->index is used to generate filter and index, dont need after that.
        auto ssindex = SSTableIndex{std::move(*_sstable->getIndex())};
        index = new IndexMap{};
        auto count = getHeader()->entries_count;
        filter = new Filter{10 * count, count, 0};
        for (const auto &item:ssindex) {
            index->insert({item.key, item.offset});
            filter->add(item.key);
        }
    }
}